

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O0

void chan_calc(YM2151 *PSG,uint chan)

{
  INT32 IVar1;
  uint uVar2;
  int iVar3;
  YM2151Operator *OP;
  int local_2c;
  uint local_28;
  INT32 out;
  UINT32 AM;
  uint env;
  YM2151Operator *op;
  uint chan_local;
  YM2151 *PSG_local;
  
  local_28 = 0;
  if (PSG->Muted[chan] == '\0') {
    PSG->mem = 0;
    PSG->c2 = 0;
    PSG->c1 = 0;
    PSG->m2 = 0;
    OP = PSG->oper + (chan << 2);
    *OP->mem_connect = OP->mem_value;
    if (OP->ams != 0) {
      local_28 = PSG->lfa << ((char)OP->ams - 1U & 0x1f);
    }
    uVar2 = OP->tl + OP->volume + (local_28 & OP->AMmask);
    local_2c = OP->fb_out_prev + OP->fb_out_curr;
    OP->fb_out_prev = OP->fb_out_curr;
    if (OP->connect == (INT32 *)0x0) {
      IVar1 = OP->fb_out_prev;
      PSG->c2 = IVar1;
      PSG->c1 = IVar1;
      PSG->mem = IVar1;
    }
    else {
      *OP->connect = OP->fb_out_prev;
    }
    OP->fb_out_curr = 0;
    if (uVar2 < 0x340) {
      if (OP->fb_shift == 0) {
        local_2c = 0;
      }
      iVar3 = op_calc1(OP,uVar2,local_2c << ((byte)OP->fb_shift & 0x1f));
      OP->fb_out_curr = iVar3;
    }
    uVar2 = OP[1].tl + OP[1].volume + (local_28 & OP[1].AMmask);
    if (uVar2 < 0x340) {
      iVar3 = op_calc(OP + 1,uVar2,PSG->m2);
      *OP[1].connect = iVar3 + *OP[1].connect;
    }
    uVar2 = OP[2].tl + OP[2].volume + (local_28 & OP[2].AMmask);
    if (uVar2 < 0x340) {
      iVar3 = op_calc(OP + 2,uVar2,PSG->c1);
      *OP[2].connect = iVar3 + *OP[2].connect;
    }
    uVar2 = OP[3].tl + OP[3].volume + (local_28 & OP[3].AMmask);
    if (uVar2 < 0x340) {
      iVar3 = op_calc(OP + 3,uVar2,PSG->c2);
      PSG->chanout[chan] = iVar3 + PSG->chanout[chan];
    }
    OP->mem_value = PSG->mem;
  }
  return;
}

Assistant:

INLINE void chan_calc( YM2413*chip, OPLL_CH *CH )
{
	OPLL_SLOT *SLOT;
	unsigned int env;
	signed int out;
	signed int phase_modulation;    /* phase modulation input (SLOT 2) */


	if (CH->Muted)
		return;

	/* SLOT 1 */
	SLOT = &CH->SLOT[SLOT1];
	env  = volume_calc(SLOT);
	out  = SLOT->op1_out[0] + SLOT->op1_out[1];

	SLOT->op1_out[0] = SLOT->op1_out[1];
	phase_modulation = SLOT->op1_out[0];

	SLOT->op1_out[1] = 0;

	if( env < ENV_QUIET )
	{
		if (!SLOT->fb_shift)
			out = 0;
		SLOT->op1_out[1] = op_calc1(SLOT->phase, env, (out<<SLOT->fb_shift), SLOT->wavetable );
	}

	/* SLOT 2 */
	SLOT++;
	env = volume_calc(SLOT);
	if( env < ENV_QUIET )
	{
		chip->output[0] += op_calc(SLOT->phase, env, phase_modulation, SLOT->wavetable);
	}
}